

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

unsigned_long
rcg::anon_unknown_5::getBufferPartValue<unsigned_long>
          (shared_ptr<const_rcg::GenTLWrapper> *gentl,void *stream,void *buffer,uint32_t part,
          BUFFER_PART_INFO_CMD cmd)

{
  element_type *peVar1;
  uint32_t in_ECX;
  BUFFER_HANDLE in_RDX;
  DS_HANDLE in_RSI;
  BUFFER_PART_INFO_CMD in_R8D;
  size_t size;
  INFO_DATATYPE type;
  unsigned_long ret;
  size_t local_38;
  INFO_DATATYPE local_2c;
  unsigned_long local_28;
  BUFFER_PART_INFO_CMD local_20;
  uint32_t local_1c;
  BUFFER_HANDLE local_18;
  DS_HANDLE local_10;
  
  local_28 = 0;
  local_38 = 8;
  if ((in_RSI != (DS_HANDLE)0x0) && (in_RDX != (BUFFER_HANDLE)0x0)) {
    local_20 = in_R8D;
    local_1c = in_ECX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    peVar1 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x127da8);
    (*peVar1->DSGetBufferPartInfo)
              (local_10,local_18,local_1c,local_20,&local_2c,&local_28,&local_38);
  }
  return local_28;
}

Assistant:

inline T getBufferPartValue(const std::shared_ptr<const GenTLWrapper> &gentl,
                                              void *stream, void *buffer, uint32_t part,
                                              GenTL::BUFFER_PART_INFO_CMD cmd)
{
  T ret=0;

  GenTL::INFO_DATATYPE type;
  size_t size=sizeof(T);

  if (stream != 0 && buffer != 0)
  {
    gentl->DSGetBufferPartInfo(stream, buffer, part, cmd, &type, &ret, &size);
  }

  return ret;
}